

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  vec<6U,_float> *p;
  long lVar1;
  tile_details *ptVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  long lVar6;
  uint32 uVar7;
  uint uVar8;
  float *pfVar9;
  uint16 uVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  float dist2;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  uVar19 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar21 = (ulong)(this->m_tiles).m_size;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar19;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar21 * data;
  uVar19 = ((data + 1) * uVar21) / uVar19;
  if (SUB164(auVar4 / auVar3,0) < (uint)uVar19) {
    uVar21 = SUB168(auVar4 / auVar3,0) & 0xffffffff;
    do {
      ptVar2 = (this->m_tiles).m_p;
      if (ptVar2[uVar21].pixels.m_size != 0) {
        p = &ptVar2[uVar21].color_endpoint;
        if (*(int *)((long)pData_ptr + 0x80) == 0) {
LAB_00174dd5:
          uVar14 = *(uint *)((long)pData_ptr + 0x70);
        }
        else {
          uVar7 = fast_hash(p,0x18);
          uVar8 = uVar7 * -0x61c88647 >> (*(byte *)((long)pData_ptr + 0x78) & 0x1f);
          lVar12 = *(long *)((long)pData_ptr + 0x68);
          lVar16 = (ulong)uVar8 * 0x20;
          bVar5 = true;
          uVar14 = uVar8;
          if (*(char *)(lVar12 + 0x1c + lVar16) != '\0') {
            if (*(float *)(lVar12 + lVar16) == p->m_s[0]) {
              uVar17 = 0xffffffffffffffff;
              lVar20 = 0;
              do {
                if (uVar17 == 4) {
                  uVar17 = 5;
                  break;
                }
                lVar1 = uVar17 * 4;
                uVar17 = uVar17 + 1;
                lVar6 = lVar20 + 1;
                lVar20 = lVar20 + 1;
              } while (*(float *)(lVar12 + lVar16 + 8 + lVar1) == p->m_s[lVar6]);
              if (4 < uVar17) {
                bVar5 = false;
                goto LAB_00174dcd;
              }
            }
            uVar18 = *(int *)((long)pData_ptr + 0x70) - 1;
            uVar17 = (ulong)(uVar8 - 1);
            if (uVar8 == 0) {
              uVar17 = (ulong)uVar18;
            }
            uVar14 = (uint)uVar17;
            if (uVar14 != uVar8) {
              pfVar11 = (float *)(lVar12 + (ulong)uVar18 * 0x20);
              pfVar9 = (float *)(lVar12 + lVar16) + -8;
              if (uVar8 == 0) {
                pfVar9 = pfVar11;
              }
              do {
                uVar14 = (uint)uVar17;
                if (*(char *)(pfVar9 + 7) == '\0') break;
                if (p->m_s[0] == *pfVar9) {
                  uVar17 = 0xffffffffffffffff;
                  lVar12 = 0;
                  do {
                    if (uVar17 == 4) {
                      uVar17 = 5;
                      break;
                    }
                    lVar16 = uVar17 + 2;
                    uVar17 = uVar17 + 1;
                    lVar20 = lVar12 + 1;
                    lVar12 = lVar12 + 1;
                  } while (pfVar9[lVar16] == p->m_s[lVar20]);
                  if (4 < uVar17) {
                    bVar5 = false;
                    break;
                  }
                }
                bVar22 = uVar14 == 0;
                uVar14 = uVar14 - 1;
                if (bVar22) {
                  uVar14 = uVar18;
                }
                uVar17 = (ulong)uVar14;
                pfVar9 = pfVar9 + -8;
                if (bVar22) {
                  pfVar9 = pfVar11;
                }
              } while (uVar14 != uVar8);
            }
          }
LAB_00174dcd:
          if (bVar5) goto LAB_00174dd5;
        }
        fVar23 = 0.0;
        lVar12 = 0;
        do {
          fVar24 = *(float *)(*(long *)((long)pData_ptr + 0x98) +
                              (ulong)*(uint *)(*(long *)((long)pData_ptr + 0x68) + 0x18 +
                                              (ulong)uVar14 * 0x20) * 0x18 + lVar12 * 4) -
                   p->m_s[lVar12];
          fVar23 = fVar23 + fVar24 * fVar24;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 6);
        uVar17 = 0;
        uVar10 = 0;
        if ((ulong)*(uint *)((long)pData_ptr + 0xa0) != 0) {
          pfVar9 = (float *)(*(long *)((long)pData_ptr + 0x98) + 0x14);
          uVar13 = 0;
          fVar24 = 1e+37;
          do {
            fVar25 = pfVar9[-5] - ptVar2[uVar21].color_endpoint.m_s[0];
            fVar26 = pfVar9[-4] - ptVar2[uVar21].color_endpoint.m_s[1];
            fVar25 = fVar26 * fVar26 + fVar25 * fVar25;
            iVar15 = 7;
            if ((fVar25 <= fVar23) &&
               (fVar27 = pfVar9[-3] - ptVar2[uVar21].color_endpoint.m_s[2],
               fVar26 = pfVar9[-2] - ptVar2[uVar21].color_endpoint.m_s[3],
               fVar25 = fVar26 * fVar26 + fVar27 * fVar27 + fVar25, fVar25 <= fVar23)) {
              fVar27 = pfVar9[-1] - ptVar2[uVar21].color_endpoint.m_s[4];
              fVar26 = *pfVar9 - ptVar2[uVar21].color_endpoint.m_s[5];
              fVar25 = fVar26 * fVar26 + fVar27 * fVar27 + fVar25;
              iVar15 = 0;
              if (fVar25 < fVar24) {
                iVar15 = 0;
                if (fVar25 == 0.0) {
                  iVar15 = 5;
                }
                uVar17 = uVar13 & 0xffffffff;
                fVar24 = fVar25;
              }
            }
            uVar10 = (uint16)uVar17;
            if ((iVar15 != 7) && (iVar15 != 0)) break;
            uVar13 = uVar13 + 1;
            pfVar9 = pfVar9 + 6;
          } while (*(uint *)((long)pData_ptr + 0xa0) != uVar13);
        }
        (this->m_tiles).m_p[uVar21].cluster_indices[0] = uVar10;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (uVar19 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_clusters_task(uint64 data, void* pData_ptr) {
  tree_clusterizer<vec6F>* vq = (tree_clusterizer<vec6F>*)pData_ptr;
  const crnlib::vector<vec6F>& codebook = vq->get_codebook();
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++) {
    if (m_tiles[t].pixels.size()) {
      const vec6F& v = m_tiles[t].color_endpoint;
      float node_dist = codebook[vq->get_node_index(v)].squared_distance(v);
      float best_dist = math::cNearlyInfinite;
      uint best_index = 0;
      for (uint i = 0; i < codebook.size(); i++) {
        const vec6F& c = codebook[i];
        float dist = 0;
        float d0 = c[0] - v[0]; dist += d0 * d0;
        float d1 = c[1] - v[1]; dist += d1 * d1;
        if (dist > node_dist)
          continue;
        float d2 = c[2] - v[2]; dist += d2 * d2;
        float d3 = c[3] - v[3]; dist += d3 * d3;
        if (dist > node_dist)
          continue;
        float d4 = c[4] - v[4]; dist += d4 * d4;
        float d5 = c[5] - v[5]; dist += d5 * d5;
        if (dist < best_dist) {
          best_dist = dist;
          best_index = i;
          if (best_dist == 0.0f)
            break;
        }
      }
      m_tiles[t].cluster_indices[cColor] = best_index;
    }
  }
}